

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

string * __thiscall FIX::FieldMap::calculateString(FieldMap *this,string *result)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  pointer this_00;
  
  this_00 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
    do {
      if ((this_00->m_data)._M_string_length == 0) {
        FieldBase::encodeTo(this_00,&this_00->m_data);
      }
      std::__cxx11::string::_M_append((char *)result,(ulong)(this_00->m_data)._M_dataplus._M_p);
      if (((this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
         (p_Var3 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
         p_Var3 != (_Base_ptr)0x0)) {
        iVar2 = this_00->m_tag;
        p_Var5 = &p_Var1->_M_header;
        do {
          if (iVar2 <= (int)*(size_t *)(p_Var3 + 1)) {
            p_Var5 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < iVar2];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= iVar2)) {
          for (puVar4 = *(undefined8 **)((long)p_Var5 + 0x28);
              puVar4 != *(undefined8 **)((long)p_Var5 + 0x28 + 8); puVar4 = puVar4 + 1) {
            calculateString((FieldMap *)*puVar4,result);
          }
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return result;
}

Assistant:

std::string& FieldMap::calculateString( std::string& result ) const
{  
  Fields::const_iterator i;
  for ( i = m_fields.begin(); i != m_fields.end(); ++i )
  {
    result += i->getFixString();

    // add groups if they exist
    if( !m_groups.size() ) continue;
    Groups::const_iterator j = m_groups.find( i->getTag() );
    if ( j == m_groups.end() ) continue;
    std::vector < FieldMap* > ::const_iterator k;
    for ( k = j->second.begin(); k != j->second.end(); ++k )
      ( *k ) ->calculateString( result );
  }
  return result;
}